

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  size_t sVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  char *lhs_expression;
  char *rhs_expression;
  AssertHelper *this_00;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__3;
  StringIO stringio;
  string stringbuf;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char contents [24];
  AssertionResult gtest_ar;
  size_t num_bytes;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  string kExpectedSparse;
  string kExpectedDense;
  TypeParam ht_out;
  _IO_FILE *in_stack_fffffffffffffb08;
  BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  hasher *in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  undefined8 in_stack_fffffffffffffb38;
  Type TVar5;
  string *s;
  AssertHelper *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  char *in_stack_fffffffffffffb78;
  char *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  AssertHelper *in_stack_fffffffffffffb90;
  AssertionResult local_3f8 [2];
  AssertionResult local_3d8;
  string local_3c8 [55];
  undefined1 local_391;
  AssertionResult local_390;
  StringIO local_380;
  string local_378;
  allocator local_341;
  string local_340 [32];
  AssertionResult local_320 [2];
  allocator local_2f9;
  string local_2f8 [32];
  AssertionResult local_2d8 [2];
  int local_2b8;
  undefined4 local_2b4;
  AssertionResult local_2b0 [2];
  size_t local_290;
  AssertionResult local_288;
  char local_278 [48];
  undefined8 local_248;
  AssertionResult local_240;
  size_t local_230;
  string local_228 [55];
  undefined1 local_1f1;
  AssertionResult local_1f0;
  string local_1e0 [55];
  undefined1 local_1a9;
  AssertionResult local_1a8;
  string local_198 [55];
  undefined1 local_161;
  AssertionResult local_160;
  FILE *local_150;
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [48];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_e8;
  Hasher local_d8;
  Hasher local_cc;
  BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  local_c0;
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  Hasher::Hasher(&local_cc,0);
  Hasher::Hasher(&local_d8,0);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::Alloc(&local_e8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
             (size_type)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
             (key_equal *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             (allocator_type *)in_stack_fffffffffffffb10);
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  ::~Alloc(&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,anon_var_dwarf_14da82,0x18,&local_119);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"$hu1",0x14,&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  bVar2 = google::
          HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
          ::supports_readwrite
                    ((HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                      *)&local_c0);
  if (bVar2) {
    local_150 = tmpfile();
    local_161 = local_150 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xfb83c6);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_160);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_198);
      testing::Message::~Message((Message *)0xfb8517);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb85ab);
    local_1a9 = google::
                BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::write_metadata<_IO_FILE>(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xfb85f2);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_1e0);
      testing::Message::~Message((Message *)0xfb86c7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb875b);
    local_1f1 = google::
                BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                ::write_nopointer_data<_IO_FILE>
                          (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xfb87a2);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_228);
      testing::Message::~Message((Message *)0xfb8877);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb890e);
    local_230 = ftell(local_150);
    rewind(local_150);
    local_248 = 0x18;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (unsigned_long *)in_stack_fffffffffffffb10);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_240);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::AssertionResult::failure_message((AssertionResult *)0xfb89c3);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xfb8a26);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb8a97);
    local_290 = fread(local_278,1,local_230,local_150);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (unsigned_long *)in_stack_fffffffffffffb10);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_288);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      in_stack_fffffffffffffb90 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xfb8b46);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xfb8ba9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb8c1a);
    local_2b4 = 0xffffffff;
    in_stack_fffffffffffffb8c = fgetc(local_150);
    local_2b8 = in_stack_fffffffffffffb8c;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
               (int *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (int *)in_stack_fffffffffffffb10);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      in_stack_fffffffffffffb80 =
           testing::AssertionResult::failure_message((AssertionResult *)0xfb8cbc);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      testing::Message::~Message((Message *)0xfb8d19);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb8d8a);
    fclose(local_150);
    in_stack_fffffffffffffb74 = (int)local_278[0];
    in_stack_fffffffffffffb78 = (char *)std::__cxx11::string::operator[]((ulong)local_118);
    sVar1 = local_230;
    if (in_stack_fffffffffffffb74 == *in_stack_fffffffffffffb78) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,local_278,sVar1,&local_2f9);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        testing::AssertionResult::failure_message((AssertionResult *)0xfb8ee7);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb40,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                   (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
        testing::Message::~Message((Message *)0xfb8f44);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb8faf);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,local_278,sVar1,&local_341);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_320);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        in_stack_fffffffffffffb40 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xfb90ca);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb40,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                   (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),(char *)in_stack_fffffffffffffb20
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
        testing::Message::~Message((Message *)0xfb9127);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb9192);
    }
  }
  iVar4 = (int)((ulong)in_stack_fffffffffffffb28 >> 0x20);
  bVar2 = google::
          HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                      *)&local_c0);
  if (bVar2) {
    s = &local_378;
    std::__cxx11::string::string((string *)s);
    StringIO::StringIO(&local_380,s);
    TVar5 = (Type)((ulong)s >> 0x20);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>>
            ::
            serialize<google::sparsehash_internal::pod_serializer<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,StringIO>
                      (&local_c0,&local_380);
    local_391 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb10,(bool *)in_stack_fffffffffffffb08,
               (type *)0xfb9225);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_390);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
                 (char *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb40,TVar5,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb30),
                 iVar4,(char *)in_stack_fffffffffffffb20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffb90,
                 (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
      std::__cxx11::string::~string(local_3c8);
      testing::Message::~Message((Message *)0xfb9301);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb9398);
    lhs_expression = (char *)std::__cxx11::string::operator[]((ulong)&local_378);
    iVar4 = (int)*lhs_expression;
    rhs_expression = (char *)std::__cxx11::string::operator[]((ulong)local_118);
    if (iVar4 == *rhs_expression) {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb10);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0xfb945b);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb40,TVar5,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb30)
                   ,iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xfb94b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb9523);
    }
    else {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb10);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_3f8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb40);
        testing::AssertionResult::failure_message((AssertionResult *)0xfb959b);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb40,TVar5,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb30)
                   ,iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffb90,
                   (Message *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb10);
        testing::Message::~Message((Message *)0xfb95f6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfb9661);
    }
    std::__cxx11::string::~string((string *)&local_378);
  }
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_118);
  google::
  HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)0xfb96b7);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}